

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  CURLcode CVar1;
  long lVar2;
  size_t __n;
  void *ne;
  CURLcode result;
  Curl_header_store *hs;
  size_t hlen;
  char *end;
  char *name;
  char *value;
  char *pcStack_20;
  uchar type_local;
  char *header_local;
  Curl_easy *data_local;
  
  name = (char *)0x0;
  end = (char *)0x0;
  if ((*header == '\r') || (*header == '\n')) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    value._7_1_ = type;
    pcStack_20 = header;
    header_local = (char *)data;
    hlen = (size_t)strchr(header,0xd);
    if (((char *)hlen == (char *)0x0) &&
       (hlen = (size_t)strchr(pcStack_20,10), (char *)hlen == (char *)0x0)) {
      data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else {
      lVar2 = hlen - (long)pcStack_20;
      __n = lVar2 + 1;
      if ((*pcStack_20 == ' ') || (*pcStack_20 == '\t')) {
        if (*(long *)(header_local + 0x1280) == 0) {
          data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
        }
        else {
          data_local._4_4_ = unfold_value((Curl_easy *)header_local,pcStack_20,__n);
        }
      }
      else {
        ne = (*Curl_ccalloc)(1,lVar2 + 0x31);
        if (ne == (void *)0x0) {
          data_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          memcpy((void *)((long)ne + 0x2d),pcStack_20,__n);
          *(undefined1 *)((long)ne + lVar2 + 0x2e) = 0;
          CVar1 = namevalue((char *)((long)ne + 0x2d),__n,(uint)value._7_1_,&end,&name);
          if (CVar1 == CURLE_OK) {
            *(char **)((long)ne + 0x18) = end;
            *(char **)((long)ne + 0x20) = name;
            *(byte *)((long)ne + 0x2c) = value._7_1_;
            *(undefined4 *)((long)ne + 0x28) = *(undefined4 *)(header_local + 0xd40);
            Curl_llist_insert_next
                      ((Curl_llist *)(header_local + 0x1230),
                       *(Curl_llist_element **)(header_local + 0x1238),ne,(Curl_llist_element *)ne);
            *(void **)(header_local + 0x1280) = ne;
            data_local._4_4_ = CURLE_OK;
          }
          else {
            (*Curl_cfree)(ne);
            data_local._4_4_ = CVar1;
          }
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  hlen = end - header + 1;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else
      /* can't unfold without a previous header */
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(result)
    goto fail;

  hs->name = name;
  hs->value = value;
  hs->type = type;
  hs->request = data->state.requests;

  /* insert this node into the list of headers */
  Curl_llist_insert_next(&data->state.httphdrs, data->state.httphdrs.tail,
                         hs, &hs->node);
  data->state.prevhead = hs;
  return CURLE_OK;
  fail:
  free(hs);
  return result;
}